

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InsideExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InsideExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::RangeListSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,RangeListSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  InsideExpressionSyntax *pIVar6;
  
  pIVar6 = (InsideExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InsideExpressionSyntax *)this->endPtr < pIVar6 + 1) {
    pIVar6 = (InsideExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pIVar6 + 1);
  }
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pIVar6->super_ExpressionSyntax).super_SyntaxNode.kind = InsideExpression;
  (pIVar6->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar6->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pIVar6->expr).ptr = args;
  (pIVar6->inside).kind = TVar2;
  (pIVar6->inside).field_0x2 = uVar3;
  (pIVar6->inside).numFlags = (NumericTokenFlags)NVar4.raw;
  (pIVar6->inside).rawLen = uVar5;
  (pIVar6->inside).info = pIVar1;
  (pIVar6->ranges).ptr = args_2;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pIVar6;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pIVar6;
  return pIVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }